

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O1

int __thiscall
ON_LineCurve::IsPolyline
          (ON_LineCurve *this,ON_SimpleArray<ON_3dPoint> *pline_points,
          ON_SimpleArray<double> *pline_t)

{
  int iVar1;
  int iVar2;
  double local_28;
  
  if ((pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) && (-1 < pline_points->m_capacity)) {
    pline_points->m_count = 0;
  }
  if ((pline_t != (ON_SimpleArray<double> *)0x0) && (-1 < pline_t->m_capacity)) {
    pline_t->m_count = 0;
  }
  iVar2 = 0;
  iVar1 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this);
  if ((char)iVar1 != '\0') {
    if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
      if ((uint)pline_points->m_capacity < 2) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity(pline_points,2);
      }
      ON_SimpleArray<ON_3dPoint>::Append(pline_points,&(this->m_line).from);
      ON_SimpleArray<ON_3dPoint>::Append(pline_points,&(this->m_line).to);
    }
    iVar2 = 2;
    if (pline_t != (ON_SimpleArray<double> *)0x0) {
      if ((uint)pline_t->m_capacity < 2) {
        ON_SimpleArray<double>::SetCapacity(pline_t,2);
      }
      local_28 = ON_Interval::operator[](&this->m_t,0);
      ON_SimpleArray<double>::Append(pline_t,&local_28);
      local_28 = ON_Interval::operator[](&this->m_t,1);
      ON_SimpleArray<double>::Append(pline_t,&local_28);
    }
  }
  return iVar2;
}

Assistant:

int ON_LineCurve::IsPolyline(
      ON_SimpleArray<ON_3dPoint>* pline_points,
      ON_SimpleArray<double>* pline_t
      ) const
{
  int rc = 0;
  if ( pline_points )
    pline_points->SetCount(0);
  if ( pline_t )
    pline_t->SetCount(0);
  if ( IsValid() )
  {
    rc = 2;
    if ( pline_points )
    {
      pline_points->Reserve(2);
      pline_points->Append( m_line.from );
      pline_points->Append( m_line.to );
    }
    if ( pline_t )
    {
      pline_t->Reserve(2);
      pline_t->Append( m_t[0] );
      pline_t->Append( m_t[1] );
    }
  }
  return rc;
}